

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  reference ppTVar1;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t i;
  size_type local_20;
  
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    for (local_20 = std::
                    vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                    ::size((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                            *)(in_RDI + 0x10)); local_20 != 0; local_20 = local_20 - 1) {
      ppTVar1 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::operator[]((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                              *)(in_RDI + 0x10),local_20 - 1);
      (*(*ppTVar1)->_vptr_TestEventListener[0x10])(*ppTVar1,in_RSI,(ulong)in_EDX);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = listeners_.size(); i > 0; i--) {
      listeners_[i - 1]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}